

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::getNonbasicFreeColumnSet(HEkkPrimal *this)

{
  long lVar1;
  bool bVar2;
  HSet *this_00;
  const_reference pvVar3;
  const_reference pvVar4;
  long *in_RDI;
  bool nonbasic_free;
  HighsInt iCol;
  SimplexBasis *basis;
  HighsSimplexInfo *info;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  int entry;
  
  if ((int)in_RDI[0x1f] != 0) {
    lVar1 = *in_RDI;
    this_00 = (HSet *)(*in_RDI + 0x2978);
    HSet::clear((HSet *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    for (entry = 0; entry < (int)in_RDI[3]; entry = entry + 1) {
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)
                          &(this_00->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)entry);
      bVar2 = false;
      if (*pvVar3 == '\x01') {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x25a8),(long)entry)
        ;
        bVar2 = false;
        if (*pvVar4 <= -INFINITY) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x25c0),
                              (long)entry);
          bVar2 = INFINITY <= *pvVar4;
        }
      }
      if (bVar2) {
        HSet::add(this_00,entry);
      }
    }
  }
  return;
}

Assistant:

void HEkkPrimal::getNonbasicFreeColumnSet() {
  if (!num_free_col) return;
  assert(num_free_col > 0);
  const HighsSimplexInfo& info = ekk_instance_.info_;
  const SimplexBasis& basis = ekk_instance_.basis_;
  nonbasic_free_col_set.clear();
  for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
    bool nonbasic_free = basis.nonbasicFlag_[iCol] == kNonbasicFlagTrue &&
                         info.workLower_[iCol] <= -kHighsInf &&
                         info.workUpper_[iCol] >= kHighsInf;
    if (nonbasic_free) nonbasic_free_col_set.add(iCol);
  }
  //  nonbasic_free_col_set.print();
}